

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall
Parser::printError<Identifier>(Parser *this,Token *token,char *text,Identifier *args)

{
  string sStack_38;
  
  tinyformat::format<Identifier>(&sStack_38,text,args);
  printError(this,token,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void printError(const Token& token, const char* text, const Args&... args)
	{
		printError(token, tfm::format(text,args...));
	}